

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

void predict_iforest<double,unsigned_long>
               (double *numeric_data,int *categ_data,bool is_col_major,size_t ld_numeric,
               size_t ld_categ,double *Xc,unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *Xr,
               unsigned_long *Xr_ind,unsigned_long *Xr_indptr,size_t nrows,int nthreads,
               bool standardize,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               double *output_depths,unsigned_long *tree_num,double *per_tree_depths,
               TreesIndexer *indexer)

{
  double dVar1;
  pointer pSVar2;
  pointer puVar3;
  pointer pIVar4;
  void *__tmp;
  ulong uVar5;
  double *pdVar6;
  unsigned_long *puVar7;
  long lVar8;
  size_t sVar9;
  ExtIsoForest *pEVar10;
  pointer pvVar11;
  pointer pvVar12;
  undefined8 uVar13;
  ScoringMetric SVar14;
  undefined7 in_register_00000011;
  PredictionData<double,_unsigned_long> *pPVar15;
  PredictionData<double,_unsigned_long> *extraout_RDX;
  PredictionData<double,_unsigned_long> *extraout_RDX_00;
  PredictionData<double,_unsigned_long> *extraout_RDX_01;
  pointer pvVar16;
  pointer pvVar17;
  size_t row;
  unsigned_long *puVar18;
  double *pdVar19;
  size_t sVar20;
  uint uVar21;
  undefined7 uVar23;
  size_t *psVar22;
  pointer pvVar24;
  pointer pvVar25;
  size_t *psVar26;
  pointer pIVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  PredictionData<double,_unsigned_long> prediction_data;
  double local_f0;
  undefined8 local_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  long local_c0;
  ulong local_b8;
  int *local_b0;
  long local_a8 [2];
  int local_94;
  PredictionData<double,_unsigned_long> local_90;
  
  pPVar15 = (PredictionData<double,_unsigned_long> *)CONCAT71(in_register_00000011,is_col_major);
  if (nrows == 0) {
    return;
  }
  local_90.nrows = nrows;
  local_90.Xc_ind = Xc_ind;
  local_90.Xc_indptr = Xc_indptr;
  local_90.Xr = Xr;
  local_90.Xr_ind = Xr_ind;
  local_94 = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    local_94 = nthreads;
  }
  local_90.Xr_indptr = Xr_indptr;
  local_b0 = categ_data;
  local_90.numeric_data = numeric_data;
  local_90.categ_data = categ_data;
  local_90.is_col_major = is_col_major;
  local_90.ncols_numeric = ld_numeric;
  local_90.ncols_categ = ld_categ;
  local_90.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (unsigned_long *)0x0) {
    batched_csc_predict<double,unsigned_long>
              (&local_90,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
    pPVar15 = extraout_RDX;
LAB_00145435:
    if (model_outputs != (IsoForest *)0x0) {
      pvVar24 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar17 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00145441;
    }
    lVar8 = ((long)(model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    auVar34._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar34._0_8_ = lVar8;
    auVar34._12_4_ = 0x45300000;
    dStack_d0 = auVar34._8_8_ - 1.9342813113834067e+25;
    local_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    dVar35 = model_outputs_ext->exp_avg_depth * local_d8;
    SVar14 = model_outputs_ext->scoring_metric;
    bVar30 = SVar14 == Density;
    bVar31 = SVar14 == BoxedRatio;
    uVar21 = (uint)(SVar14 == BoxedDensity);
    local_e8 = CONCAT44(local_e8._4_4_,(int)CONCAT71((int7)((ulong)pPVar15 >> 8),1));
LAB_00145553:
    bVar32 = SVar14 == BoxedDensity2;
  }
  else {
    if (model_outputs == (IsoForest *)0x0) {
      if ((((Xc_indptr == (unsigned_long *)0x0) && (model_outputs_ext->missing_action == Fail)) &&
          (Xr_indptr == (unsigned_long *)0x0)) &&
         ((categ_data == (int *)0x0 && (model_outputs_ext->has_range_penalty == false)))) {
        pvVar12 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (nrows == 1 || !is_col_major) {
          lVar8 = 0;
          local_d8 = 0.0;
          do {
            local_f0 = 0.0;
            pvVar25 = pvVar12;
            if ((long)pvVar11 - (long)pvVar12 != 0) {
              uVar5 = ((long)pvVar11 - (long)pvVar12 >> 3) * -0x5555555555555555;
              lVar29 = 0;
              uVar28 = 0;
              puVar18 = tree_num;
              pdVar19 = per_tree_depths;
              do {
                puVar7 = puVar18;
                if (tree_num == (unsigned_long *)0x0) {
                  puVar7 = tree_num;
                }
                pdVar6 = (double *)(uVar5 * lVar8 + (long)pdVar19);
                if (per_tree_depths == (double *)0x0) {
                  pdVar6 = (double *)0x0;
                }
                traverse_hplane_fast_rowmajor<double,unsigned_long>
                          ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                           ((long)&(pvVar25->
                                   super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar29),
                           model_outputs_ext,
                           local_90.numeric_data + local_90.ncols_numeric * (long)local_d8,&local_f0
                           ,puVar7,pdVar6,(size_t)local_d8);
                uVar28 = uVar28 + 1;
                pvVar25 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar12 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar5 = ((long)pvVar12 - (long)pvVar25 >> 3) * -0x5555555555555555;
                puVar18 = puVar18 + nrows;
                pdVar19 = pdVar19 + 1;
                lVar29 = lVar29 + 0x18;
              } while (uVar28 < uVar5);
            }
            output_depths[(long)local_d8] = local_f0;
            local_d8 = (double)((long)local_d8 + 1);
            lVar8 = lVar8 + 8;
            pvVar11 = pvVar12;
            pPVar15 = (PredictionData<double,_unsigned_long> *)0xaaaaaaaaaaaaaaab;
            pvVar12 = pvVar25;
          } while (local_d8 != (double)nrows);
        }
        else {
          lVar8 = 0;
          local_d8 = 0.0;
          do {
            local_f0 = 0.0;
            pvVar25 = pvVar12;
            if ((long)pvVar11 - (long)pvVar12 != 0) {
              uVar5 = ((long)pvVar11 - (long)pvVar12 >> 3) * -0x5555555555555555;
              lVar29 = 0;
              uVar28 = 0;
              pdVar19 = per_tree_depths;
              puVar18 = tree_num;
              do {
                puVar7 = puVar18;
                if (tree_num == (unsigned_long *)0x0) {
                  puVar7 = tree_num;
                }
                pdVar6 = (double *)(uVar5 * lVar8 + (long)pdVar19);
                if (per_tree_depths == (double *)0x0) {
                  pdVar6 = (double *)0x0;
                }
                traverse_hplane_fast_colmajor<PredictionData<double,unsigned_long>,unsigned_long>
                          ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                           ((long)&(pvVar25->
                                   super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar29),
                           model_outputs_ext,&local_90,&local_f0,puVar7,pdVar6,(size_t)local_d8);
                uVar28 = uVar28 + 1;
                pvVar25 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar12 = (model_outputs_ext->hplanes).
                          super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                uVar5 = ((long)pvVar12 - (long)pvVar25 >> 3) * -0x5555555555555555;
                puVar18 = puVar18 + nrows;
                pdVar19 = pdVar19 + 1;
                lVar29 = lVar29 + 0x18;
              } while (uVar28 < uVar5);
            }
            output_depths[(long)local_d8] = local_f0;
            local_d8 = (double)((long)local_d8 + 1);
            lVar8 = lVar8 + 8;
            pvVar11 = pvVar12;
            pPVar15 = &local_90;
            pvVar12 = pvVar25;
          } while (local_d8 != (double)nrows);
        }
      }
      else {
        local_b8 = nrows * 8;
        dVar35 = 0.0;
        local_d8 = 0.0;
        pvVar12 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar11 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_f0 = 0.0;
          pvVar25 = pvVar11;
          if ((long)pvVar12 - (long)pvVar11 != 0) {
            uVar5 = ((long)pvVar12 - (long)pvVar11 >> 3) * -0x5555555555555555;
            lVar8 = 0;
            uVar28 = 0;
            pdVar19 = per_tree_depths;
            puVar18 = tree_num;
            local_e0 = dVar35;
            do {
              puVar7 = puVar18;
              if (tree_num == (unsigned_long *)0x0) {
                puVar7 = tree_num;
              }
              pdVar6 = (double *)(uVar5 * (long)local_e0 + (long)pdVar19);
              if (per_tree_depths == (double *)0x0) {
                pdVar6 = (double *)0x0;
              }
              traverse_hplane<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar25->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar8),
                         model_outputs_ext,&local_90,&local_f0,
                         (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                         (ImputedData<unsigned_long,_double> *)0x0,puVar7,pdVar6,(size_t)local_d8);
              uVar28 = uVar28 + 1;
              pvVar25 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar11 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar5 = ((long)pvVar11 - (long)pvVar25 >> 3) * -0x5555555555555555;
              puVar18 = (unsigned_long *)((long)puVar18 + local_b8);
              pdVar19 = pdVar19 + 1;
              lVar8 = lVar8 + 0x18;
              pPVar15 = extraout_RDX_01;
              dVar35 = local_e0;
            } while (uVar28 < uVar5);
          }
          output_depths[(long)local_d8] = local_f0;
          local_d8 = (double)((long)local_d8 + 1);
          dVar35 = (double)((long)dVar35 + 8);
          pvVar12 = pvVar11;
          pvVar11 = pvVar25;
        } while (local_d8 != (double)nrows);
      }
      goto LAB_00145435;
    }
    if (model_outputs->missing_action != Fail) {
LAB_001450d3:
      local_c0 = 0;
      local_b8 = nrows * 8;
      local_e0 = 0.0;
      uVar5 = 0;
      sVar9 = 0;
      do {
        if ((uVar5 & 1) == 0) {
          pvVar24 = (model_outputs->trees).
                    super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = (long)(model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar24;
          local_e8 = uVar5;
          if (lVar8 == 0) {
            dVar35 = 0.0;
          }
          else {
            uVar5 = (lVar8 >> 3) * -0x5555555555555555;
            dVar35 = 0.0;
            lVar8 = 0;
            uVar28 = 0;
            puVar18 = tree_num;
            pdVar19 = per_tree_depths;
            do {
              puVar7 = puVar18;
              if (tree_num == (unsigned_long *)0x0) {
                puVar7 = tree_num;
              }
              pdVar6 = (double *)(uVar5 * (long)local_e0 + (long)pdVar19);
              if (per_tree_depths == (double *)0x0) {
                pdVar6 = (double *)0x0;
              }
              local_d8 = dVar35;
              dVar35 = traverse_itree<PredictionData<double,unsigned_long>,unsigned_long,ImputedData<unsigned_long,double>>
                                 ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                  ((long)&(pvVar24->
                                          super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                          _M_impl + lVar8),model_outputs,&local_90,
                                  (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                  (ImputedData<unsigned_long,_double> *)0x0,0.0,sVar9,puVar7,pdVar6,
                                  0);
              dVar35 = local_d8 + dVar35;
              uVar28 = uVar28 + 1;
              pvVar24 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = ((long)(model_outputs->trees).
                             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar24 >> 3) *
                      -0x5555555555555555;
              puVar18 = (unsigned_long *)((long)puVar18 + local_b8);
              pdVar19 = pdVar19 + 1;
              lVar8 = lVar8 + 0x18;
            } while (uVar28 < uVar5);
          }
          output_depths[sVar9] = dVar35;
          uVar5 = local_e8;
        }
        sVar9 = sVar9 + 1;
        local_e0 = (double)((long)local_e0 + 8);
      } while (sVar9 != nrows);
      if ((uVar5 & 1) != 0) {
        local_a8[0] = local_c0;
        if (local_c0 != 0) {
          std::__exception_ptr::exception_ptr::_M_addref();
        }
        uVar13 = std::rethrow_exception((exception_ptr)local_a8);
        if (local_c0 != 0) {
          std::__exception_ptr::exception_ptr::_M_release();
        }
        _Unwind_Resume(uVar13);
      }
      pPVar15 = (PredictionData<double,_unsigned_long> *)per_tree_depths;
      if (local_c0 != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
        pPVar15 = extraout_RDX_00;
      }
      goto LAB_00145435;
    }
    if (model_outputs->new_cat_action == Weighted) {
      if (((Xc_indptr == (unsigned_long *)0x0) && (Xr_indptr == (unsigned_long *)0x0)) &&
         (categ_data == (int *)0x0 || model_outputs->cat_split_type == SingleCateg))
      goto LAB_001459c8;
      goto LAB_001450d3;
    }
    if (Xc_indptr != (unsigned_long *)0x0 || Xr_indptr != (unsigned_long *)0x0) goto LAB_001450d3;
LAB_001459c8:
    if (model_outputs->has_range_penalty != false) goto LAB_001450d3;
    if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
      pvVar24 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar17 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = ((long)pvVar17 - (long)pvVar24 >> 3) * -0x5555555555555555;
      sVar9 = 0;
      do {
        if (pvVar17 == pvVar24) {
          dVar35 = 0.0;
        }
        else {
          dVar35 = 0.0;
          lVar29 = 0;
          do {
            puVar18 = tree_num + lVar29 * nrows;
            if (tree_num == (unsigned_long *)0x0) {
              puVar18 = (unsigned_long *)0x0;
            }
            pdVar19 = per_tree_depths + lVar8 * sVar9 + lVar29;
            if (per_tree_depths == (double *)0x0) {
              pdVar19 = (double *)0x0;
            }
            pIVar4 = pvVar24[lVar29].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pIVar27 = pIVar4;
            if (pIVar4->tree_left == 0) {
              sVar20 = 0;
            }
            else {
              psVar22 = &pIVar4->tree_left;
              do {
                psVar26 = &pIVar27->tree_right;
                if (numeric_data[sVar9 * ld_numeric + pIVar27->col_num] <= pIVar27->num_split) {
                  psVar26 = psVar22;
                }
                sVar20 = *psVar26;
                pIVar27 = pIVar4 + sVar20;
                psVar22 = &pIVar4[sVar20].tree_left;
              } while (*psVar22 != 0);
            }
            dVar1 = pIVar27->score;
            if (puVar18 != (unsigned_long *)0x0) {
              puVar18[sVar9] = sVar20;
            }
            if (pdVar19 != (double *)0x0) {
              *pdVar19 = dVar1;
            }
            dVar35 = dVar35 + dVar1;
            lVar29 = lVar29 + 1;
          } while (lVar29 != lVar8 + (ulong)(lVar8 == 0));
        }
        output_depths[sVar9] = dVar35;
        sVar9 = sVar9 + 1;
      } while (sVar9 != nrows);
    }
    else {
      local_e0 = (double)(nrows * 8);
      lVar8 = 0;
      local_d8 = 0.0;
      pvVar16 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pvVar24 = (model_outputs->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pvVar17 = pvVar24;
        local_f0 = 0.0;
        pvVar24 = pvVar17;
        if ((long)pvVar16 - (long)pvVar17 != 0) {
          uVar5 = ((long)pvVar16 - (long)pvVar17 >> 3) * -0x5555555555555555;
          lVar29 = 0;
          uVar28 = 0;
          pdVar19 = per_tree_depths;
          puVar18 = tree_num;
          do {
            puVar7 = puVar18;
            if (tree_num == (unsigned_long *)0x0) {
              puVar7 = tree_num;
            }
            pdVar6 = (double *)(uVar5 * lVar8 + (long)pdVar19);
            if (per_tree_depths == (double *)0x0) {
              pdVar6 = (double *)0x0;
            }
            traverse_itree_no_recurse<PredictionData<double,unsigned_long>,unsigned_long>
                      ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                       ((long)&(pvVar24->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar29),model_outputs,
                       &local_90,&local_f0,puVar7,pdVar6,(size_t)local_d8);
            uVar28 = uVar28 + 1;
            pvVar24 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar17 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            uVar5 = ((long)pvVar17 - (long)pvVar24 >> 3) * -0x5555555555555555;
            puVar18 = (unsigned_long *)((long)puVar18 + (long)local_e0);
            pdVar19 = pdVar19 + 1;
            lVar29 = lVar29 + 0x18;
          } while (uVar28 < uVar5);
        }
        output_depths[(long)local_d8] = local_f0;
        local_d8 = (double)((long)local_d8 + 1);
        lVar8 = lVar8 + 8;
        pvVar16 = pvVar17;
      } while (local_d8 != (double)nrows);
    }
LAB_00145441:
    lVar8 = ((long)pvVar17 - (long)pvVar24 >> 3) * -0x5555555555555555;
    auVar33._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar33._0_8_ = lVar8;
    auVar33._12_4_ = 0x45300000;
    dStack_d0 = auVar33._8_8_ - 1.9342813113834067e+25;
    local_d8 = dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    dVar35 = model_outputs->exp_avg_depth * local_d8;
    SVar14 = model_outputs->scoring_metric;
    bVar30 = SVar14 == Density;
    uVar23 = (undefined7)((ulong)model_outputs >> 8);
    if (bVar30) {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar31 = model_outputs_ext->scoring_metric == BoxedRatio;
        bVar30 = true;
LAB_0014553c:
        uVar21 = (uint)CONCAT71(uVar23,model_outputs_ext->scoring_metric == BoxedDensity);
LAB_00145546:
        SVar14 = model_outputs_ext->scoring_metric;
        local_e8 = local_e8 & 0xffffffff00000000;
        goto LAB_00145553;
      }
      bVar31 = false;
LAB_0014557d:
      bVar32 = SVar14 == BoxedDensity2;
      uVar21 = 0;
LAB_00145586:
      local_e8 = (ulong)local_e8._4_4_ << 0x20;
    }
    else {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar30 = model_outputs_ext->scoring_metric == Density;
        bVar31 = true;
        if (SVar14 == BoxedRatio) goto LAB_0014553c;
        bVar31 = model_outputs_ext->scoring_metric == BoxedRatio;
        uVar21 = (uint)CONCAT71(uVar23,1);
        if ((SVar14 == BoxedDensity) ||
           (uVar21 = (uint)CONCAT71(uVar23,model_outputs_ext->scoring_metric == BoxedDensity),
           SVar14 != BoxedDensity2)) goto LAB_00145546;
        bVar32 = true;
        goto LAB_00145586;
      }
      bVar31 = SVar14 == BoxedRatio;
      if (SVar14 != BoxedDensity) goto LAB_0014557d;
      uVar21 = (uint)CONCAT71(uVar23,1);
      bVar30 = false;
      local_e8 = (ulong)local_e8._4_4_ << 0x20;
      bVar32 = false;
    }
  }
  local_b8 = CONCAT44(local_b8._4_4_,uVar21);
  if (standardize) {
    if (bVar30 || bVar32) {
      sVar9 = 0;
      do {
        output_depths[sVar9] = output_depths[sVar9] / -local_d8;
        sVar9 = sVar9 + 1;
      } while (nrows != sVar9);
    }
    else if ((char)uVar21 == '\0') {
      if (bVar31) {
        sVar9 = 0;
        do {
          output_depths[sVar9] = output_depths[sVar9] / local_d8;
          sVar9 = sVar9 + 1;
        } while (nrows != sVar9);
      }
      else {
        sVar9 = 0;
        local_e0 = dVar35;
        do {
          dVar35 = exp2(-output_depths[sVar9] / local_e0);
          output_depths[sVar9] = dVar35;
          sVar9 = sVar9 + 1;
        } while (nrows != sVar9);
      }
    }
    else {
      sVar9 = 0;
      do {
        dVar35 = exp(output_depths[sVar9] / local_d8);
        output_depths[sVar9] = -dVar35;
        sVar9 = sVar9 + 1;
      } while (nrows != sVar9);
    }
  }
  else if ((bVar30 || (char)uVar21 != '\0') || bVar32) {
    sVar9 = 0;
    do {
      dVar35 = exp(output_depths[sVar9] / local_d8);
      output_depths[sVar9] = dVar35;
      sVar9 = sVar9 + 1;
    } while (nrows != sVar9);
  }
  else if (bVar31) {
    sVar9 = 0;
    do {
      output_depths[sVar9] = output_depths[sVar9] / -local_d8;
      sVar9 = sVar9 + 1;
    } while (nrows != sVar9);
  }
  else {
    sVar9 = 0;
    do {
      output_depths[sVar9] = output_depths[sVar9] / local_d8;
      sVar9 = sVar9 + 1;
    } while (nrows != sVar9);
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar30 || (local_b8 & 1) != 0) || bVar32)) {
    pEVar10 = (ExtIsoForest *)model_outputs;
    if ((char)local_e8 != '\0') {
      pEVar10 = model_outputs_ext;
    }
    lVar8 = nrows * -0x5555555555555555 *
            ((long)(pEVar10->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar10->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (lVar8 != 0) {
      lVar29 = 0;
      do {
        dVar35 = exp(per_tree_depths[lVar29]);
        per_tree_depths[lVar29] = dVar35;
        lVar29 = lVar29 + 1;
      } while (lVar8 - lVar29 != 0);
    }
  }
  if (tree_num == (unsigned_long *)0x0) {
    return;
  }
  if ((indexer == (TreesIndexer *)0x0) ||
     (pSVar2 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start,
     pSVar2 == (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
LAB_001457dd:
    remap_terminal_trees<PredictionData<double,unsigned_long>,unsigned_long>
              (model_outputs,model_outputs_ext,&local_90,tree_num,local_94);
  }
  else {
    if ((char)local_e8 == '\0') {
      if ((model_outputs->missing_action == Divide) ||
         (((lVar8 = (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
           model_outputs->new_cat_action == Weighted && (local_b0 != (int *)0x0)) &&
          (model_outputs->cat_split_type == SubSet)))) goto LAB_001457dd;
    }
    else {
      lVar8 = (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar8 != 0) {
      lVar29 = (lVar8 >> 3) * -0x5555555555555555;
      lVar8 = 0;
      do {
        puVar3 = pSVar2[lVar8].terminal_node_mappings.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar9 = 0;
        do {
          tree_num[sVar9] = puVar3[tree_num[sVar9]];
          sVar9 = sVar9 + 1;
        } while (nrows != sVar9);
        lVar8 = lVar8 + 1;
        tree_num = tree_num + nrows;
      } while (lVar8 != lVar29 + (ulong)(lVar29 == 0));
    }
  }
  return;
}

Assistant:

void predict_iforest(real_t *restrict numeric_data, int *restrict categ_data,
                     bool is_col_major, size_t ld_numeric, size_t ld_categ,
                     real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double *restrict output_depths,   sparse_ix *restrict tree_num,
                     double *restrict per_tree_depths,
                     TreesIndexer *indexer)
{
    if (unlikely(!nrows)) return;

    /* put data in a struct for passing it in fewer lines */
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, ld_numeric, ld_categ,
                                      Xc, Xc_ind, Xc_indptr,
                                      Xr, Xr_ind, Xr_indptr};

    int nthreads_orig = nthreads;
    if ((size_t)nthreads > nrows)
        nthreads = nrows;

    /* For batch predictions of sparse CSC, will take a specialized route */
    if (prediction_data.Xc_indptr != NULL && (prediction_data.categ_data == NULL || prediction_data.is_col_major))
    {
        batched_csc_predict(prediction_data, nthreads_orig,
                            model_outputs, model_outputs_ext,
                            output_depths, tree_num,
                            per_tree_depths);
    }

    /* Regular case (no specialized CSC route) */
    else if (model_outputs != NULL)
    {
        if (
            model_outputs->missing_action == Fail &&
            (model_outputs->new_cat_action != Weighted || model_outputs->cat_split_type == SingleCateg || prediction_data.categ_data == NULL) &&
            prediction_data.Xc_indptr == NULL && prediction_data.Xr_indptr == NULL &&
            !model_outputs->has_range_penalty
            )
        {
            if (prediction_data.categ_data == NULL && (nrows == 1 || !prediction_data.is_col_major))
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_fast(model_outputs->trees[tree],
                                            *model_outputs,
                                            prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                            score,
                                            (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                            (per_tree_depths == NULL)?
                                                NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                            (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_no_recurse(model_outputs->trees[tree],
                                                  *model_outputs,
                                                  prediction_data,
                                                  score,
                                                  (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                  (per_tree_depths == NULL)?
                                                      NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                  (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            bool threw_exception = false;
            std::exception_ptr ex = NULL;

            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths, threw_exception, ex)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                if (threw_exception) continue;
                double score = 0;
                try
                {
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        score += traverse_itree(model_outputs->trees[tree],
                                                *model_outputs,
                                                prediction_data,
                                                (std::vector<ImputeNode>*)NULL,
                                                (ImputedData<sparse_ix, double>*)NULL,
                                                (double)0,
                                                (size_t) row,
                                                (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                (per_tree_depths == NULL)?
                                                    NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                (size_t) 0);
                    }
                    output_depths[row] = score;
                }
                catch (...)
                {
                    #pragma omp critical
                    {
                        if (!threw_exception)
                        {
                            threw_exception = true;
                            ex = std::current_exception();
                        }
                    }
                }
            }

            if (threw_exception)
                std::rethrow_exception(ex);
        }
    }
    

    else
    {
        if (
            model_outputs_ext->missing_action == Fail &&
            prediction_data.categ_data == NULL &&
            prediction_data.Xc_indptr == NULL &&
            prediction_data.Xr_indptr == NULL &&
            !model_outputs_ext->has_range_penalty
            )
        {
            if (prediction_data.is_col_major && nrows > 1)
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_colmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_rowmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                double score = 0;
                for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                {
                    traverse_hplane(model_outputs_ext->hplanes[tree],
                                    *model_outputs_ext,
                                    prediction_data,
                                    score,
                                    (std::vector<ImputeNode>*)NULL,
                                    (ImputedData<sparse_ix, double>*)NULL,
                                    (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                    (per_tree_depths == NULL)?
                                        NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                    (size_t) row);
                }
                output_depths[row] = score;
            }
        }
    }

    /* translate sum-of-depths to outlier score */
    double ntrees, depth_divisor;
    if (model_outputs != NULL)
    {
        ntrees = (double) model_outputs->trees.size();
        depth_divisor = ntrees * (model_outputs->exp_avg_depth);
    }

    else
    {
        ntrees = (double) model_outputs_ext->hplanes.size();
        depth_divisor = ntrees * (model_outputs_ext->exp_avg_depth);
    }

    
    /* for density and boxed_ratio, each tree will have 'log(d)'' instead of 'd' */
    bool is_density = (model_outputs != NULL && model_outputs->scoring_metric == Density) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == Density);
    bool is_bratio  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedRatio) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedRatio);
    bool is_bdens   = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity);
    bool is_bdens2  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity2) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity2);

    if (standardize)
    {
        if (is_density || is_bdens2)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else if (is_bdens)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = -std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = output_depths[row] / ntrees;
        }

        else
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp2( - output_depths[row] / depth_divisor );
        }
    }

    else
    {
        if (is_density || is_bdens || is_bdens2)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }
    }

    if (per_tree_depths != NULL && (is_density || is_bdens || is_bdens2))
    {
        size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < nrows*ntrees; ix++)
            per_tree_depths[ix] = std::exp(per_tree_depths[ix]);
    }


    /* re-map tree numbers to start at zero (if predicting tree numbers) */
    /* Note: usually this type of 'prediction' is not required,
       thus this mapping is not stored in the model objects so as to
       save memory */
    if (tree_num != NULL)
    {
        if (indexer != NULL && !indexer->indices.empty())
        {
            size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
            if (model_outputs != NULL)
            {
                if (model_outputs->missing_action == Divide)
                    goto manual_remap;
                if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL)
                    goto manual_remap;
            }

            for (size_t tree = 0; tree < ntrees; tree++)
            {
                size_t *restrict mapping = indexer->indices[tree].terminal_node_mappings.data();
                for (size_t row = 0; row < nrows; row++)
                {
                    tree_num[row + tree*nrows] = mapping[tree_num[row + tree*nrows]];
                }
            }
        }

        else
        {
            manual_remap:
            remap_terminal_trees(model_outputs, model_outputs_ext,
                                 prediction_data, tree_num, nthreads);
        }
    }
}